

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Color::Color(Color *this,Defaults color)

{
  undefined4 in_ESI;
  Color *in_RDI;
  
  Serializeable::Serializeable(&in_RDI->super_Serializeable);
  (in_RDI->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Color_0011aa88;
  in_RDI->transparent = false;
  in_RDI->red = 0;
  in_RDI->green = 0;
  in_RDI->blue = 0;
  switch(in_ESI) {
  case 0:
    assign(in_RDI,0,0xff,0xff);
    break;
  case 1:
    assign(in_RDI,0,0,0);
    break;
  case 2:
    assign(in_RDI,0,0,0xff);
    break;
  case 3:
    assign(in_RDI,0xa5,0x2a,0x2a);
    break;
  case 4:
    assign(in_RDI,0,0xff,0xff);
    break;
  case 5:
    assign(in_RDI,0xff,0,0xff);
    break;
  case 6:
    assign(in_RDI,0,0x80,0);
    break;
  case 7:
    assign(in_RDI,0,0xff,0);
    break;
  case 8:
    assign(in_RDI,0xff,0,0xff);
    break;
  case 9:
    assign(in_RDI,0xff,0xa5,0);
    break;
  case 10:
    assign(in_RDI,0x80,0,0x80);
    break;
  case 0xb:
    assign(in_RDI,0xff,0,0);
    break;
  case 0xc:
    assign(in_RDI,0xc0,0xc0,0xc0);
    break;
  case 0xd:
    assign(in_RDI,0xff,0xff,0xff);
    break;
  case 0xe:
    assign(in_RDI,0xff,0xff,0);
    break;
  default:
    in_RDI->transparent = true;
  }
  return;
}

Assistant:

Color(Defaults color)
            : transparent(false), red(0), green(0), blue(0)
        {
            switch (color)
            {
                case Aqua: assign(0, 255, 255); break;
                case Black: assign(0, 0, 0); break;
                case Blue: assign(0, 0, 255); break;
                case Brown: assign(165, 42, 42); break;
                case Cyan: assign(0, 255, 255); break;
                case Fuchsia: assign(255, 0, 255); break;
                case Green: assign(0, 128, 0); break;
                case Lime: assign(0, 255, 0); break;
                case Magenta: assign(255, 0, 255); break;
                case Orange: assign(255, 165, 0); break;
                case Purple: assign(128, 0, 128); break;
                case Red: assign(255, 0, 0); break;
                case Silver: assign(192, 192, 192); break;
                case White: assign(255, 255, 255); break;
                case Yellow: assign(255, 255, 0); break;
                default: transparent = true; break;
            }
        }